

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Cell __thiscall cppforth::Forth::dataSpaceAtCell(Forth *this,Cell index)

{
  bool bVar1;
  reference pVVar2;
  reference pVVar3;
  byte *pbVar4;
  ulong local_40;
  size_t i;
  Cell tmpRes;
  Cell tmp;
  iterator itend;
  iterator it;
  Cell index_local;
  Forth *this_local;
  
  itend = std::
          vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
          ::begin(&this->VirtualMemory);
  _tmpRes = std::
            vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
            ::end(&this->VirtualMemory);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
                      (&itend,(__normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
                               *)&tmpRes);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return 0;
    }
    pVVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
             ::operator*(&itend);
    if ((pVVar2->start <= index) &&
       (pVVar2 = __gnu_cxx::
                 __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
                 ::operator*(&itend), index < pVVar2->end)) break;
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
    ::operator++(&itend);
  }
  i._0_4_ = 0;
  local_40 = 0;
  it._M_current._4_4_ = index;
  while( true ) {
    bVar1 = false;
    if (local_40 < 4) {
      pVVar2 = __gnu_cxx::
               __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
               ::operator*(&itend);
      bVar1 = it._M_current._4_4_ < pVVar2->end;
    }
    if (!bVar1) break;
    pVVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
             ::operator*(&itend);
    pVVar3 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
             ::operator*(&itend);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&pVVar2->segment,(ulong)(it._M_current._4_4_ - pVVar3->start));
    i._0_4_ = (uint)*pbVar4 << ((byte)(local_40 << 3) & 0x1f) | (uint)i;
    local_40 = local_40 + 1;
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return (uint)i;
}

Assistant:

Cell dataSpaceAtCell(Cell index){
			for (auto it = VirtualMemory.begin(), itend=VirtualMemory.end(); it != itend ; ++it){
				if ((*it).start <= index && (*it).end > index){
					Cell tmp{ 0 }, tmpRes{ 0 };
					for (size_t i = 0; i < sizeof(Cell) && (*it).end > index; ++i,++index){
						tmp=(*it).segment.at(index - (*it).start) ;
						tmp <<= 8*i;
						tmpRes |= tmp;
					}
					return tmpRes;		
				}
			}
			return Cell(0); // all memory is filled by 0x00
		}